

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AmpIO.cpp
# Opt level: O1

void __thiscall AmpIO::DisplayReadBuffer(AmpIO *this,ostream *out)

{
  char cVar1;
  uint32_t uVar2;
  uint uVar3;
  uint uVar4;
  ostream *poVar5;
  long lVar6;
  ulong uVar7;
  
  *(uint *)(out + *(long *)(*(long *)out + -0x18) + 0x18) =
       *(uint *)(out + *(long *)(*(long *)out + -0x18) + 0x18) & 0xffffffb5 | 8;
  poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)out);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
  std::ostream::put((char)poVar5);
  std::ostream::flush();
  *(uint *)(out + *(long *)(*(long *)out + -0x18) + 0x18) =
       *(uint *)(out + *(long *)(*(long *)out + -0x18) + 0x18) & 0xffffffb5 | 8;
  poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)out);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
  std::ostream::put((char)poVar5);
  std::ostream::flush();
  *(uint *)(out + *(long *)(*(long *)out + -0x18) + 0x18) =
       *(uint *)(out + *(long *)(*(long *)out + -0x18) + 0x18) & 0xffffffb5 | 8;
  poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)out);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
  std::ostream::put((char)poVar5);
  std::ostream::flush();
  *(uint *)(out + *(long *)(*(long *)out + -0x18) + 0x18) =
       *(uint *)(out + *(long *)(*(long *)out + -0x18) + 0x18) & 0xffffffb5 | 8;
  poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)out);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
  std::ostream::put((char)poVar5);
  std::ostream::flush();
  if (4 < this->ENC_POS_OFFSET) {
    lVar6 = 0x13;
    do {
      *(uint *)(out + *(long *)(*(long *)out + -0x18) + 0x18) =
           *(uint *)(out + *(long *)(*(long *)out + -0x18) + 0x18) & 0xffffffb5 | 8;
      poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)out);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5," ",1);
      uVar7 = lVar6 - 0xe;
      lVar6 = lVar6 + 1;
    } while (uVar7 < this->ENC_POS_OFFSET);
  }
  cVar1 = (char)out;
  std::ios::widen((char)*(undefined8 *)(*(long *)out + -0x18) + cVar1);
  std::ostream::put(cVar1);
  std::ostream::flush();
  uVar7 = (ulong)this->ENC_POS_OFFSET;
  if (this->ENC_POS_OFFSET < this->ENC_VEL_OFFSET) {
    do {
      *(uint *)(out + *(long *)(*(long *)out + -0x18) + 0x18) =
           *(uint *)(out + *(long *)(*(long *)out + -0x18) + 0x18) & 0xffffffb5 | 8;
      poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)out);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5," ",1);
      uVar7 = uVar7 + 1;
    } while (uVar7 < this->ENC_VEL_OFFSET);
  }
  std::ios::widen((char)*(undefined8 *)(*(long *)out + -0x18) + cVar1);
  std::ostream::put(cVar1);
  std::ostream::flush();
  uVar7 = (ulong)this->ENC_VEL_OFFSET;
  if (this->ENC_VEL_OFFSET < this->ENC_QTR1_OFFSET) {
    do {
      *(uint *)(out + *(long *)(*(long *)out + -0x18) + 0x18) =
           *(uint *)(out + *(long *)(*(long *)out + -0x18) + 0x18) & 0xffffffb5 | 8;
      poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)out);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5," ",1);
      uVar7 = uVar7 + 1;
    } while (uVar7 < this->ENC_QTR1_OFFSET);
  }
  std::ios::widen((char)*(undefined8 *)(*(long *)out + -0x18) + cVar1);
  std::ostream::put(cVar1);
  std::ostream::flush();
  uVar7 = (ulong)this->ENC_QTR1_OFFSET;
  if (this->ENC_QTR1_OFFSET < this->ENC_QTR5_OFFSET) {
    do {
      *(uint *)(out + *(long *)(*(long *)out + -0x18) + 0x18) =
           *(uint *)(out + *(long *)(*(long *)out + -0x18) + 0x18) & 0xffffffb5 | 8;
      poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)out);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5," ",1);
      uVar7 = uVar7 + 1;
    } while (uVar7 < this->ENC_QTR5_OFFSET);
  }
  std::ios::widen((char)*(undefined8 *)(*(long *)out + -0x18) + cVar1);
  std::ostream::put(cVar1);
  std::ostream::flush();
  uVar7 = (ulong)this->ENC_QTR5_OFFSET;
  if (this->ENC_QTR5_OFFSET < this->ENC_RUN_OFFSET) {
    do {
      *(uint *)(out + *(long *)(*(long *)out + -0x18) + 0x18) =
           *(uint *)(out + *(long *)(*(long *)out + -0x18) + 0x18) & 0xffffffb5 | 8;
      poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)out);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5," ",1);
      uVar7 = uVar7 + 1;
    } while (uVar7 < this->ENC_RUN_OFFSET);
  }
  std::ios::widen((char)*(undefined8 *)(*(long *)out + -0x18) + cVar1);
  std::ostream::put(cVar1);
  std::ostream::flush();
  uVar7 = (ulong)this->ENC_RUN_OFFSET;
  if (this->ENC_RUN_OFFSET < this->MOTOR_STATUS_OFFSET) {
    do {
      *(uint *)(out + *(long *)(*(long *)out + -0x18) + 0x18) =
           *(uint *)(out + *(long *)(*(long *)out + -0x18) + 0x18) & 0xffffffb5 | 8;
      poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)out);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5," ",1);
      uVar7 = uVar7 + 1;
    } while (uVar7 < this->MOTOR_STATUS_OFFSET);
  }
  std::ios::widen((char)*(undefined8 *)(*(long *)out + -0x18) + cVar1);
  std::ostream::put(cVar1);
  std::ostream::flush();
  uVar2 = BoardIO::GetFirmwareVersion((BoardIO *)this);
  if (7 < uVar2) {
    uVar4 = this->MOTOR_STATUS_OFFSET;
    uVar7 = (ulong)uVar4;
    uVar3 = (*(this->super_FpgaIO).super_BoardIO._vptr_BoardIO[1])(this);
    if (uVar4 < uVar3 >> 2) {
      do {
        *(uint *)(out + *(long *)(*(long *)out + -0x18) + 0x18) =
             *(uint *)(out + *(long *)(*(long *)out + -0x18) + 0x18) & 0xffffffb5 | 8;
        poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)out);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5," ",1);
        uVar7 = uVar7 + 1;
        uVar4 = (*(this->super_FpgaIO).super_BoardIO._vptr_BoardIO[1])(this);
      } while (uVar7 < uVar4 >> 2);
    }
    std::ios::widen((char)*(undefined8 *)(*(long *)out + -0x18) + cVar1);
    std::ostream::put(cVar1);
    std::ostream::flush();
  }
  *(uint *)(out + *(long *)(*(long *)out + -0x18) + 0x18) =
       *(uint *)(out + *(long *)(*(long *)out + -0x18) + 0x18) & 0xffffffb5 | 2;
  return;
}

Assistant:

void AmpIO::DisplayReadBuffer(std::ostream &out) const
{
    // first two quadlets are timestamp and status, resp.
    out << std::hex << ReadBuffer[TIMESTAMP_OFFSET] << std::endl;
    out << std::hex << ReadBuffer[STATUS_OFFSET] << std::endl;
    // next two quadlets are digital I/O and amplifier temperature
    out << std::hex << ReadBuffer[DIGIO_OFFSET] << std::endl;
    out << std::hex << ReadBuffer[TEMP_OFFSET] << std::endl;

    // remaining quadlets are in groups of NumMotors/NumEncoders as follows:
    //   - motor current and analog pot per channel
    //   - encoder position per channel
    //   - encoder velocity per channel
    //   - encoder acceleration data (depends on firmware version)
    unsigned int i;
    for (i = MOTOR_CURR_OFFSET; i < ENC_POS_OFFSET; i++)
        out << std::hex << ReadBuffer[i] << " ";
    out << std::endl;
    for (i = ENC_POS_OFFSET; i < ENC_VEL_OFFSET; i++)
        out << std::hex << ReadBuffer[i] << " ";
    out << std::endl;
    for (i = ENC_VEL_OFFSET; i < ENC_QTR1_OFFSET; i++)
        out << std::hex << ReadBuffer[i] << " ";
    out << std::endl;
    for (i = ENC_QTR1_OFFSET; i < ENC_QTR5_OFFSET; i++)
        out << std::hex << ReadBuffer[i] << " ";
    out << std::endl;
    for (i = ENC_QTR5_OFFSET; i < ENC_RUN_OFFSET; i++)
        out << std::hex << ReadBuffer[i] << " ";
    out << std::endl;
    for (i = ENC_RUN_OFFSET; i < MOTOR_STATUS_OFFSET; i++)
        out << std::hex << ReadBuffer[i] << " ";
    out << std::endl;
    if (GetFirmwareVersion() >= 8) {
        for (i = MOTOR_STATUS_OFFSET; i < GetReadNumBytes()/sizeof(quadlet_t); i++)
            out << std::hex << ReadBuffer[i] << " ";
        out << std::endl;
    }
    out << std::dec;
}